

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

void __thiscall
duckdb::WindowQuantileState<signed_char>::SkipListUpdater::Left
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  char *__y;
  undefined4 extraout_var;
  undefined1 extraout_DL;
  ulong in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  idx_t *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  pair<unsigned_long,_signed_char> local_28;
  ulong local_18;
  ulong local_10 [2];
  
  local_18 = in_RDX;
  for (local_10[0] = in_RSI; local_10[0] < local_18; local_10[0] = local_10[0] + 1) {
    bVar1 = QuantileIncluded<signed_char>::operator()
                      ((QuantileIncluded<signed_char> *)
                       CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
    if (bVar1) {
      this_00 = (HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
                 *)*in_RDI;
      __y = QuantileCursor<signed_char>::operator[]
                      ((QuantileCursor<signed_char> *)
                       CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0),
                       (idx_t)in_stack_ffffffffffffffc8);
      ::std::pair<unsigned_long,_signed_char>::pair<unsigned_long_&,_true>(&local_28,local_10,__y);
      iVar2 = duckdb_skiplistlib::skip_list::
              HeadNode<std::pair<unsigned_long,_signed_char>,_duckdb::SkipLess<std::pair<unsigned_long,_signed_char>_>_>
              ::remove(this_00,(char *)&local_28);
      in_stack_ffffffffffffffc8 = (idx_t *)CONCAT44(extraout_var,iVar2);
      in_stack_ffffffffffffffd0 = extraout_DL;
    }
  }
  return;
}

Assistant:

inline void Left(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.remove(SkipType(begin, data[begin]));
				}
			}
		}